

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int yaml_parser_parse(yaml_parser_t *parser,yaml_event_t *event)

{
  yaml_event_t *event_local;
  yaml_parser_t *parser_local;
  
  if (parser == (yaml_parser_t *)0x0) {
    __assert_fail("parser",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/parser.c"
                  ,0xac,"int yaml_parser_parse(yaml_parser_t *, yaml_event_t *)");
  }
  if (event != (yaml_event_t *)0x0) {
    memset(event,0,0x68);
    if (((parser->stream_end_produced == 0) && (parser->error == YAML_NO_ERROR)) &&
       (parser->state != YAML_PARSE_END_STATE)) {
      parser_local._4_4_ = yaml_parser_state_machine(parser,event);
    }
    else {
      parser_local._4_4_ = 1;
    }
    return parser_local._4_4_;
  }
  __assert_fail("event",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/parser.c"
                ,0xad,"int yaml_parser_parse(yaml_parser_t *, yaml_event_t *)");
}

Assistant:

YAML_DECLARE(int)
yaml_parser_parse(yaml_parser_t *parser, yaml_event_t *event)
{
    assert(parser);     /* Non-NULL parser object is expected. */
    assert(event);      /* Non-NULL event object is expected. */

    /* Erase the event object. */

    memset(event, 0, sizeof(yaml_event_t));

    /* No events after the end of the stream or error. */

    if (parser->stream_end_produced || parser->error ||
            parser->state == YAML_PARSE_END_STATE) {
        return 1;
    }

    /* Generate the next event. */

    return yaml_parser_state_machine(parser, event);
}